

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::is_hex(char c,int *v)

{
  int iVar1;
  int *in_RSI;
  char in_DIL;
  bool local_1;
  
  if (('\x1f' < in_DIL) && (iVar1 = isdigit((int)in_DIL), iVar1 != 0)) {
    *in_RSI = in_DIL + -0x30;
    return true;
  }
  if ((in_DIL < 'A') || ('F' < in_DIL)) {
    if ((in_DIL < 'a') || ('f' < in_DIL)) {
      local_1 = false;
    }
    else {
      *in_RSI = in_DIL + -0x57;
      local_1 = true;
    }
  }
  else {
    *in_RSI = in_DIL + -0x37;
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool is_hex(char c, int &v) {
  if (0x20 <= c && isdigit(c)) {
    v = c - '0';
    return true;
  } else if ('A' <= c && c <= 'F') {
    v = c - 'A' + 10;
    return true;
  } else if ('a' <= c && c <= 'f') {
    v = c - 'a' + 10;
    return true;
  }
  return false;
}